

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

bool __thiscall ON_Matrix::Multiply(ON_Matrix *this,ON_Matrix *a,ON_Matrix *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  double **ppdVar4;
  double **ppdVar5;
  double **ppdVar6;
  double *pdVar7;
  bool bVar8;
  double ***pppdVar9;
  double ***pppdVar10;
  double ***pppdVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  ON_Matrix tmp;
  ON_Matrix OStack_68;
  
  if (((a->m_col_count == b->m_row_count) && (0 < a->m_col_count && 0 < a->m_row_count)) &&
     (0 < b->m_col_count)) {
    if (this == a) {
      ON_Matrix(&OStack_68,a);
      bVar8 = Multiply(this,&OStack_68,b);
    }
    else {
      if (this != b) {
        Create(this,a->m_row_count,b->m_col_count);
        pppdVar9 = &a->m;
        if (a->m_row_count == (a->m_rowmem).m_count) {
          pppdVar9 = &(a->m_rowmem).m_a;
        }
        pppdVar10 = &b->m;
        if (b->m_row_count == (b->m_rowmem).m_count) {
          pppdVar10 = &(b->m_rowmem).m_a;
        }
        uVar1 = this->m_row_count;
        pppdVar11 = &this->m;
        if (uVar1 == (this->m_rowmem).m_count) {
          pppdVar11 = &(this->m_rowmem).m_a;
        }
        if ((int)uVar1 < 1) {
          return true;
        }
        ppdVar4 = *pppdVar9;
        ppdVar5 = *pppdVar10;
        ppdVar6 = *pppdVar11;
        uVar2 = a->m_col_count;
        uVar3 = this->m_col_count;
        uVar12 = 0;
        do {
          if (0 < (int)uVar3) {
            pdVar7 = ppdVar6[uVar12];
            uVar13 = 0;
            do {
              if ((int)uVar2 < 1) {
                dVar15 = 0.0;
              }
              else {
                dVar15 = 0.0;
                uVar14 = 0;
                do {
                  dVar15 = dVar15 + ppdVar4[uVar12][uVar14] * ppdVar5[uVar14][uVar13];
                  uVar14 = uVar14 + 1;
                } while (uVar2 != uVar14);
              }
              pdVar7[uVar13] = dVar15;
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar3);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar1);
        return true;
      }
      ON_Matrix(&OStack_68,b);
      bVar8 = Multiply(this,a,&OStack_68);
    }
    ~ON_Matrix(&OStack_68);
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

int ON_Matrix::ColCount() const
{
  return m_col_count;
}